

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::DynamicStateBaseClass::setDynamicDepthStencilState
          (DynamicStateBaseClass *this,float minDepthBounds,float maxDepthBounds,
          deUint32 stencilFrontCompareMask,deUint32 stencilFrontWriteMask,
          deUint32 stencilFrontReference,deUint32 stencilBackCompareMask,
          deUint32 stencilBackWriteMask,deUint32 stencilBackReference)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s **ppVVar2;
  deUint32 stencilBackWriteMask_local;
  deUint32 stencilBackCompareMask_local;
  deUint32 stencilFrontReference_local;
  deUint32 stencilFrontWriteMask_local;
  deUint32 stencilFrontCompareMask_local;
  float maxDepthBounds_local;
  float minDepthBounds_local;
  DynamicStateBaseClass *this_local;
  
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x52])(minDepthBounds,maxDepthBounds,pDVar1,*ppVVar2);
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x53])(pDVar1,*ppVVar2,1,(ulong)stencilFrontCompareMask);
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x54])(pDVar1,*ppVVar2,1,(ulong)stencilFrontWriteMask);
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x55])(pDVar1,*ppVVar2,1,(ulong)stencilFrontReference);
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x53])(pDVar1,*ppVVar2,2,(ulong)stencilBackCompareMask);
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x54])(pDVar1,*ppVVar2,2,(ulong)stencilBackWriteMask);
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x55])(pDVar1,*ppVVar2,2,(ulong)stencilBackReference);
  return;
}

Assistant:

void DynamicStateBaseClass::setDynamicDepthStencilState (const float	minDepthBounds,
														 const float	maxDepthBounds,
														 const deUint32 stencilFrontCompareMask,
														 const deUint32 stencilFrontWriteMask,
														 const deUint32 stencilFrontReference,
														 const deUint32 stencilBackCompareMask,
														 const deUint32 stencilBackWriteMask,
														 const deUint32 stencilBackReference)
{
	m_vk.cmdSetDepthBounds(*m_cmdBuffer, minDepthBounds, maxDepthBounds);
	m_vk.cmdSetStencilCompareMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontCompareMask);
	m_vk.cmdSetStencilWriteMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontWriteMask);
	m_vk.cmdSetStencilReference(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontReference);
	m_vk.cmdSetStencilCompareMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackCompareMask);
	m_vk.cmdSetStencilWriteMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackWriteMask);
	m_vk.cmdSetStencilReference(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackReference);
}